

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O0

double HTS_white_noise(HTS_Vocoder *v)

{
  int iVar1;
  HTS_Vocoder *in_RDI;
  HTS_Vocoder *in_stack_ffffffffffffffe8;
  double local_8;
  
  if (in_RDI->gauss == '\0') {
    iVar1 = HTS_mseq(in_RDI);
    local_8 = (double)iVar1;
  }
  else {
    local_8 = HTS_nrandom(in_stack_ffffffffffffffe8);
  }
  return local_8;
}

Assistant:

static double HTS_white_noise(HTS_Vocoder * v)
{
   if (v->gauss)
      return (double) HTS_nrandom(v);
   else
      return (double) HTS_mseq(v);
}